

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

int mz_zip_reader_locate_file_v2
              (mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags,mz_uint32 *pIndex)

{
  byte bVar1;
  ushort uVar2;
  mz_zip_internal_state *pmVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  mz_zip_error mVar13;
  ulong __n;
  byte bVar14;
  void *__s2;
  ulong uVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  int iVar19;
  ulong uVar20;
  byte *pbVar21;
  byte bVar22;
  long lVar23;
  mz_zip_internal_state *pState;
  bool bVar24;
  bool bVar25;
  
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if (pName == (char *)0x0 || pmVar3 == (mz_zip_internal_state *)0x0) {
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    goto LAB_00151fb9;
  }
  if (((((pmVar3->m_init_flags & 0x800) == 0) && (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) &&
      (pComment == (char *)0x0 && (flags & 0x300) == 0)) &&
     ((pmVar3->m_sorted_central_dir_offsets).m_size != 0)) {
    pvVar4 = (pmVar3->m_sorted_central_dir_offsets).m_p;
    uVar10 = pZip->m_total_files;
    sVar6 = strlen(pName);
    if (pIndex != (mz_uint32 *)0x0) {
      *pIndex = 0;
    }
    mVar13 = MZ_ZIP_FILE_NOT_FOUND;
    if ((ulong)uVar10 == 0) goto LAB_00151fb9;
    lVar9 = 0;
    lVar23 = (ulong)uVar10 - 1;
    while (lVar9 <= lVar23) {
      uVar11 = (lVar23 - lVar9 >> 1) + lVar9;
      uVar10 = *(uint *)((long)pvVar4 + (uVar11 & 0xffffffff) * 4);
      pvVar5 = (pmVar3->m_central_dir).m_p;
      uVar8 = (ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)uVar10 * 4);
      pbVar17 = (byte *)((long)pvVar5 + uVar8 + 0x2e);
      uVar2 = *(ushort *)(pbVar17 + -0x12);
      uVar20 = (ulong)uVar2;
      if ((uint)sVar6 <= (uint)uVar2) {
        uVar20 = sVar6 & 0xffffffff;
      }
      pbVar18 = (byte *)((long)pvVar5 + uVar20 + uVar8 + 0x2e);
      pbVar21 = (byte *)pName;
      if ((int)uVar20 == 0) {
        iVar19 = 0;
      }
      else {
        do {
          bVar1 = *pbVar17;
          bVar22 = bVar1 + 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar22 = bVar1;
          }
          bVar1 = *pbVar21;
          bVar14 = bVar1 + 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar14 = bVar1;
          }
          if (bVar22 != bVar14) break;
          pbVar17 = pbVar17 + 1;
          pbVar21 = pbVar21 + 1;
        } while (pbVar17 < pbVar18);
        iVar19 = (uint)bVar22 - (uint)bVar14;
      }
      if (pbVar17 == pbVar18) {
        iVar19 = (uint)uVar2 - (uint)sVar6;
      }
      lVar12 = lVar23;
      if (iVar19 == 0) {
        if (pIndex != (mz_uint32 *)0x0) {
          *pIndex = uVar10;
        }
      }
      else {
        lVar12 = uVar11 - 1;
        if (iVar19 < 0) {
          lVar9 = uVar11 + 1;
          lVar12 = lVar23;
        }
      }
      lVar23 = lVar12;
      if (iVar19 == 0) {
        return 1;
      }
    }
  }
  else {
    sVar6 = strlen(pName);
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
    if (0xffff < sVar6) goto LAB_00151fb9;
    if (pComment == (char *)0x0) {
      sVar7 = 0;
    }
    else {
      sVar7 = strlen(pComment);
    }
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
    if ((0xffff < sVar7) || (mVar13 = MZ_ZIP_FILE_NOT_FOUND, pZip->m_total_files == 0))
    goto LAB_00151fb9;
    pvVar4 = (pmVar3->m_central_dir).m_p;
    pvVar5 = (pmVar3->m_central_dir_offsets).m_p;
    uVar11 = 0;
    do {
      uVar20 = (ulong)*(uint *)((long)pvVar5 + uVar11 * 4);
      uVar2 = *(ushort *)((long)pvVar4 + uVar20 + 0x1c);
      uVar8 = (ulong)uVar2;
      bVar25 = false;
      if (sVar6 <= uVar8) {
        __s2 = (void *)((long)pvVar4 + uVar20 + 0x2e);
        if (sVar7 != 0) {
          __n = (ulong)*(ushort *)((long)pvVar4 + uVar20 + 0x20);
          if (sVar7 == __n) {
            uVar15 = (ulong)*(ushort *)((long)pvVar4 + uVar20 + 0x1e);
            if ((flags >> 8 & 1) == 0) {
              if (__n == 0) {
                bVar24 = false;
              }
              else {
                lVar9 = 0;
                do {
                  bVar1 = pComment[lVar9];
                  iVar19 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar19 = (int)(char)bVar1;
                  }
                  bVar1 = *(byte *)((long)pvVar4 + lVar9 + uVar15 + uVar20 + uVar8 + 0x2e);
                  iVar16 = bVar1 + 0x20;
                  if (0x19 < (byte)(bVar1 + 0xbf)) {
                    iVar16 = (int)(char)bVar1;
                  }
                  bVar24 = iVar19 != iVar16;
                } while ((!bVar24) && (bVar25 = __n - 1 != lVar9, lVar9 = lVar9 + 1, bVar25));
              }
            }
            else {
              iVar19 = bcmp(pComment,(void *)((long)__s2 + uVar8 + uVar15),__n);
              bVar24 = iVar19 != 0;
            }
            bVar24 = (bool)(bVar24 ^ 1);
          }
          else {
            bVar24 = false;
          }
          bVar25 = false;
          if (!bVar24) goto LAB_00151fa1;
        }
        if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
          do {
            uVar10 = *(byte *)((long)pvVar4 + uVar8 + uVar20 + 0x2d) - 0x2f;
            if ((uVar10 < 0x2e) && ((0x200000000801U >> ((ulong)uVar10 & 0x3f) & 1) != 0))
            goto LAB_00151eb6;
            bVar25 = 1 < (long)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar25);
          uVar8 = 0;
LAB_00151eb6:
          __s2 = (void *)((long)__s2 + (uVar8 & 0xffffffff));
          uVar8 = (ulong)((uint)uVar2 - (int)uVar8);
        }
        bVar25 = false;
        if (sVar6 == uVar8) {
          if ((flags >> 8 & 1) == 0) {
            if (uVar8 == 0) {
              bVar24 = false;
            }
            else {
              lVar9 = 0;
              do {
                bVar1 = pName[lVar9];
                iVar19 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  iVar19 = (int)(char)bVar1;
                }
                bVar1 = *(byte *)((long)__s2 + lVar9);
                iVar16 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  iVar16 = (int)(char)bVar1;
                }
                bVar24 = iVar19 != iVar16;
              } while ((!bVar24) && (bVar25 = uVar8 - 1 != lVar9, lVar9 = lVar9 + 1, bVar25));
            }
          }
          else {
            iVar19 = bcmp(pName,__s2,uVar8);
            bVar24 = iVar19 != 0;
          }
          bVar25 = (bool)(bVar24 ^ 1);
          if ((pIndex != (mz_uint32 *)0x0) && (!bVar24)) {
            *pIndex = (mz_uint32)uVar11;
            bVar25 = true;
          }
        }
      }
LAB_00151fa1:
      if (bVar25) {
        return 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < pZip->m_total_files);
  }
  mVar13 = MZ_ZIP_FILE_NOT_FOUND;
LAB_00151fb9:
  pZip->m_last_error = mVar13;
  return 0;
}

Assistant:

mz_bool mz_zip_reader_locate_file_v2(mz_zip_archive *pZip, const char *pName, const char *pComment, mz_uint flags, mz_uint32 *pIndex)
{
    mz_uint file_index;
    size_t name_len, comment_len;

    if (pIndex)
        *pIndex = 0;

    if ((!pZip) || (!pZip->m_pState) || (!pName))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* See if we can use a binary search */
    if (((pZip->m_pState->m_init_flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0) &&
        (pZip->m_zip_mode == MZ_ZIP_MODE_READING) &&
        ((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    {
        return mz_zip_locate_file_binary_search(pZip, pName, pIndex);
    }

    /* Locate the entry by scanning the entire central directory */
    name_len = strlen(pName);
    if (name_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    comment_len = pComment ? strlen(pComment) : 0;
    if (comment_len > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    for (file_index = 0; file_index < pZip->m_total_files; file_index++)
    {
        const mz_uint8 *pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
        mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
        const char *pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
        if (filename_len < name_len)
            continue;
        if (comment_len)
        {
            mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
            const char *pFile_comment = pFilename + filename_len + file_extra_len;
            if ((file_comment_len != comment_len) || (!mz_zip_string_equal(pComment, pFile_comment, file_comment_len, flags)))
                continue;
        }
        if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len))
        {
            int ofs = filename_len - 1;
            do
            {
                if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
                    break;
            } while (--ofs >= 0);
            ofs++;
            pFilename += ofs;
            filename_len -= ofs;
        }
        if ((filename_len == name_len) && (mz_zip_string_equal(pName, pFilename, filename_len, flags)))
        {
            if (pIndex)
                *pIndex = file_index;
            return MZ_TRUE;
        }
    }

    return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}